

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<std::pair<unsigned_int,Clasp::ConstString>>
               (pair<unsigned_int,_Clasp::ConstString> *first,
               pair<unsigned_int,_Clasp::ConstString> *last,
               pair<unsigned_int,_Clasp::ConstString> *x)

{
  pair<unsigned_int,_Clasp::ConstString> *ppVar1;
  
  ppVar1 = first;
  switch((uint)((int)last - (int)first) >> 4 & 7) {
  case 0:
    while (ppVar1 != last) {
      first = ppVar1 + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(ppVar1,x);
switchD_00141a74_caseD_7:
      ppVar1 = first + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(first,x);
switchD_00141a74_caseD_6:
      first = ppVar1 + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(ppVar1,x);
switchD_00141a74_caseD_5:
      ppVar1 = first + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(first,x);
switchD_00141a74_caseD_4:
      first = ppVar1 + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(ppVar1,x);
switchD_00141a74_caseD_3:
      ppVar1 = first + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(first,x);
switchD_00141a74_caseD_2:
      first = ppVar1 + 1;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(ppVar1,x);
switchD_00141a74_caseD_1:
      std::pair<unsigned_int,_Clasp::ConstString>::pair(first,x);
      ppVar1 = first + 1;
    }
    break;
  case 1:
    goto switchD_00141a74_caseD_1;
  case 2:
    goto switchD_00141a74_caseD_2;
  case 3:
    goto switchD_00141a74_caseD_3;
  case 4:
    goto switchD_00141a74_caseD_4;
  case 5:
    goto switchD_00141a74_caseD_5;
  case 6:
    goto switchD_00141a74_caseD_6;
  case 7:
    goto switchD_00141a74_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}